

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

Statement * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,LoopStatement *l)

{
  replaceExpression(this,&l->condition);
  replaceExpression(this,&l->numIterations);
  replaceAs<soul::AST::VariableDeclaration>(this,&l->rangeLoopInitialiser);
  replaceStatement(this,&l->iterator);
  replaceStatement(this,&l->body);
  return &l->super_Statement;
}

Assistant:

virtual AST::Statement& visit (AST::LoopStatement& l)
    {
        replaceExpression (l.condition);
        replaceExpression (l.numIterations);
        replaceAs (l.rangeLoopInitialiser);
        replaceStatement (l.iterator);
        replaceStatement (l.body);
        return l;
    }